

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_write.c
# Opt level: O0

int TIFFWriteCheck(TIFF *tif,int tiles,char *module)

{
  int iVar1;
  tmsize_t tVar2;
  char *pcVar3;
  char *module_local;
  int tiles_local;
  TIFF *tif_local;
  
  if (tif->tif_mode == 0) {
    TIFFErrorExtR(tif,module,"File not open for writing");
    tif_local._4_4_ = 0;
  }
  else if (tiles == (uint)((tif->tif_flags & 0x400) != 0)) {
    _TIFFFillStriles(tif);
    if (((tif->tif_dir).td_fieldsset[0] & 2) == 0) {
      TIFFErrorExtR(tif,module,"Must set \"ImageWidth\" before writing data");
      tif_local._4_4_ = 0;
    }
    else if (((tif->tif_dir).td_stripoffset_p == (uint64_t *)0x0) &&
            (iVar1 = TIFFSetupStrips(tif), iVar1 == 0)) {
      (tif->tif_dir).td_nstrips = 0;
      pcVar3 = "strip";
      if ((tif->tif_flags & 0x400) != 0) {
        pcVar3 = "tile";
      }
      TIFFErrorExtR(tif,module,"No space for %s arrays",pcVar3);
      tif_local._4_4_ = 0;
    }
    else {
      if ((tif->tif_flags & 0x400) == 0) {
        tif->tif_tilesize = -1;
      }
      else {
        tVar2 = TIFFTileSize(tif);
        tif->tif_tilesize = tVar2;
        if (tif->tif_tilesize == 0) {
          return 0;
        }
      }
      tVar2 = TIFFScanlineSize(tif);
      tif->tif_scanlinesize = tVar2;
      if (tif->tif_scanlinesize == 0) {
        tif_local._4_4_ = 0;
      }
      else {
        tif->tif_flags = tif->tif_flags | 0x40;
        if (((((((tif->tif_dir).td_stripoffset_entry.tdir_tag != 0) &&
               ((tif->tif_dir).td_stripoffset_entry.tdir_count == 0)) &&
              ((tif->tif_dir).td_stripoffset_entry.tdir_type == 0)) &&
             (((tif->tif_dir).td_stripoffset_entry.tdir_offset.toff_long8 == 0 &&
              ((tif->tif_dir).td_stripbytecount_entry.tdir_tag != 0)))) &&
            (((tif->tif_dir).td_stripbytecount_entry.tdir_count == 0 &&
             (((tif->tif_dir).td_stripbytecount_entry.tdir_type == 0 &&
              ((tif->tif_dir).td_stripbytecount_entry.tdir_offset.toff_long8 == 0)))))) &&
           ((tif->tif_flags & 8) == 0)) {
          TIFFForceStrileArrayWriting(tif);
        }
        tif_local._4_4_ = 1;
      }
    }
  }
  else {
    pcVar3 = "Can not write scanlines to a tiled image";
    if (tiles != 0) {
      pcVar3 = "Can not write tiles to a striped image";
    }
    TIFFErrorExtR(tif,module,pcVar3);
    tif_local._4_4_ = 0;
  }
  return tif_local._4_4_;
}

Assistant:

int TIFFWriteCheck(TIFF *tif, int tiles, const char *module)
{
    if (tif->tif_mode == O_RDONLY)
    {
        TIFFErrorExtR(tif, module, "File not open for writing");
        return (0);
    }
    if (tiles ^ isTiled(tif))
    {
        TIFFErrorExtR(tif, module,
                      tiles ? "Can not write tiles to a striped image"
                            : "Can not write scanlines to a tiled image");
        return (0);
    }

    _TIFFFillStriles(tif);

    /*
     * On the first write verify all the required information
     * has been setup and initialize any data structures that
     * had to wait until directory information was set.
     * Note that a lot of our work is assumed to remain valid
     * because we disallow any of the important parameters
     * from changing after we start writing (i.e. once
     * TIFF_BEENWRITING is set, TIFFSetField will only allow
     * the image's length to be changed).
     */
    if (!TIFFFieldSet(tif, FIELD_IMAGEDIMENSIONS))
    {
        TIFFErrorExtR(tif, module,
                      "Must set \"ImageWidth\" before writing data");
        return (0);
    }
    if (tif->tif_dir.td_stripoffset_p == NULL && !TIFFSetupStrips(tif))
    {
        tif->tif_dir.td_nstrips = 0;
        TIFFErrorExtR(tif, module, "No space for %s arrays",
                      isTiled(tif) ? "tile" : "strip");
        return (0);
    }
    if (isTiled(tif))
    {
        tif->tif_tilesize = TIFFTileSize(tif);
        if (tif->tif_tilesize == 0)
            return (0);
    }
    else
        tif->tif_tilesize = (tmsize_t)(-1);
    tif->tif_scanlinesize = TIFFScanlineSize(tif);
    if (tif->tif_scanlinesize == 0)
        return (0);
    tif->tif_flags |= TIFF_BEENWRITING;

    if (tif->tif_dir.td_stripoffset_entry.tdir_tag != 0 &&
        tif->tif_dir.td_stripoffset_entry.tdir_count == 0 &&
        tif->tif_dir.td_stripoffset_entry.tdir_type == 0 &&
        tif->tif_dir.td_stripoffset_entry.tdir_offset.toff_long8 == 0 &&
        tif->tif_dir.td_stripbytecount_entry.tdir_tag != 0 &&
        tif->tif_dir.td_stripbytecount_entry.tdir_count == 0 &&
        tif->tif_dir.td_stripbytecount_entry.tdir_type == 0 &&
        tif->tif_dir.td_stripbytecount_entry.tdir_offset.toff_long8 == 0 &&
        !(tif->tif_flags & TIFF_DIRTYDIRECT))
    {
        TIFFForceStrileArrayWriting(tif);
    }

    return (1);
}